

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

char * ucnv_getAlias_63(char *alias,uint16_t n,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  UVar1 = haveAliasData(pErrorCode);
  if (UVar1 != '\0') {
    if (alias == (char *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if (*alias != '\0') {
      uVar2 = findConverter(alias,(UBool *)0x0,pErrorCode);
      if (gMainTable.converterListSize <= uVar2) {
        return (char *)0x0;
      }
      uVar3 = (ulong)gMainTable.taggedAliasArray
                     [(gMainTable.tagListSize - 1) * gMainTable.converterListSize + uVar2];
      if (uVar3 != 0) {
        if (n < gMainTable.taggedAliasLists[uVar3]) {
          return (char *)((ulong)((uint)gMainTable.taggedAliasLists[uVar3 + (ulong)n + 1] * 2) +
                         (long)gMainTable.stringTable);
        }
        *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

U_CAPI const char* U_EXPORT2
ucnv_getAlias(const char *alias, uint16_t n, UErrorCode *pErrorCode)
{
    return ucnv_io_getAlias(alias, n, pErrorCode);
}